

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

void Gia_ManAutomWalk(Gia_Man_t *p,int nSteps,int nWalks,int fVerbose)

{
  uint uVar1;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Int_t *p_02;
  word Init;
  word wVar2;
  int iVar3;
  char *__s;
  uint i;
  bool bVar4;
  ulong local_38;
  
  iVar3 = p->nRegs;
  if (p->vCos->nSize - iVar3 == 1) {
    if (p->vCis->nSize - iVar3 < 0x41) {
      if (iVar3 < 0x41) {
        iVar3 = p->nObjs;
        p_00 = Vec_WrdAlloc(iVar3);
        p_00->nSize = iVar3;
        memset(p_00->pArray,0,(long)iVar3 << 3);
        p_01 = Vec_WrdAlloc(1000);
        p_02 = Vec_IntAlloc(1000);
        Vec_WrdPush(p_01,0);
        Vec_IntPush(p_02,1);
        Init = Gia_ManAutomInit(p);
        iVar3 = 0;
        if (0 < nWalks) {
          iVar3 = nWalks;
        }
        while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
          Gia_ManAutomWalkOne(p,nSteps,p_01,p_02,p_00,Init);
        }
        if (fVerbose != 0) {
          iVar3 = p_01->nSize;
          for (i = 0; (int)i < iVar3; i = i + 1) {
            wVar2 = Vec_WrdEntry(p_01,i);
            local_38 = wVar2 ^ Init;
            printf("%3d : ",(ulong)i);
            Extra_PrintBinary(_stdout,(uint *)&local_38,0x40);
            uVar1 = Vec_IntEntry(p_02,i);
            printf(" %d  ",(ulong)uVar1);
            putchar(10);
          }
          putchar(10);
        }
        Vec_WrdFree(p_00);
        Vec_WrdFree(p_01);
        Vec_IntFree(p_02);
        return;
      }
      __s = "Cannot simulate an automaton with more than 63 states.";
    }
    else {
      __s = "Cannot simulate an automaton with more than 64 inputs.";
    }
  }
  else {
    __s = "AIG should have one primary output.";
  }
  puts(__s);
  return;
}

Assistant:

void Gia_ManAutomWalk( Gia_Man_t * p, int nSteps, int nWalks, int fVerbose )
{
    Vec_Wrd_t * vTemp, * vStates;
    Vec_Int_t * vCounts; int i; word Init;
    if ( Gia_ManPoNum(p) != 1 )
    {
        printf( "AIG should have one primary output.\n" );
        return;
    }
    if ( Gia_ManPiNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 64 inputs.\n" );
        return;
    }
    if ( Gia_ManRegNum(p) > 64 )
    {
        printf( "Cannot simulate an automaton with more than 63 states.\n" );
        return;
    }
    vTemp   = Vec_WrdStart( Gia_ManObjNum(p) );
    vStates = Vec_WrdAlloc( 1000 );
    vCounts = Vec_IntAlloc( 1000 );
    Vec_WrdPush( vStates, 0 );
    Vec_IntPush( vCounts, 1 );
    Init = Gia_ManAutomInit( p );
    for ( i = 0; i < nWalks; i++ )
        Gia_ManAutomWalkOne( p, nSteps, vStates, vCounts, vTemp, Init );
    if ( fVerbose )
    {
        word State;
        Vec_WrdForEachEntry( vStates, State, i )
        {
            State ^= Init;
            printf( "%3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&State, 64 ); 
            printf( " %d  ", Vec_IntEntry(vCounts, i) );
            printf( "\n" );
        }
        printf( "\n" );
    }
    Vec_WrdFree( vTemp );
    Vec_WrdFree( vStates );
    Vec_IntFree( vCounts );
}